

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O2

int fits_read_ascii_region(char *filename,WCSdata *wcs,SAORegion **Rgn,int *status)

{
  RgnShape *newShape;
  char cVar1;
  shapeType sVar2;
  undefined4 uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  SAORegion *__ptr;
  char *__s;
  FILE *__stream;
  char *pcVar7;
  size_t sVar8;
  size_t sVar9;
  ushort **ppuVar10;
  RgnShape *pRVar11;
  long lVar12;
  long lVar13;
  anon_union_120_2_131c4ffb_for_param *paVar14;
  ulong uVar15;
  char *pcVar16;
  char *pcVar17;
  WCSdata *pWVar18;
  WCSdata *pWVar19;
  char *pcVar20;
  uint uVar21;
  size_t sVar22;
  ushort *puVar23;
  char *pcVar24;
  bool bVar25;
  byte bVar26;
  double dVar27;
  undefined1 auVar28 [16];
  double dVar29;
  double dVar30;
  undefined1 auVar31 [16];
  ulong uStackY_f0;
  char *local_d8;
  double local_b0;
  anon_union_120_2_131c4ffb_for_param *local_a8;
  char *endp;
  char *local_98;
  SAORegion *local_90;
  WCSdata *local_88;
  double local_80;
  char *local_78;
  double local_70;
  double y;
  double x;
  long local_58;
  ushort **local_50;
  char *local_48;
  ulong local_40;
  SAORegion **local_38;
  
  bVar26 = 0;
  if (*status != 0) {
    return *status;
  }
  __ptr = (SAORegion *)malloc(0x58);
  if (__ptr != (SAORegion *)0x0) {
    __ptr->nShapes = 0;
    __ptr->Shapes = (RgnShape *)0x0;
    if ((wcs == (WCSdata *)0x0) || (wcs->exists == 0)) {
      (__ptr->wcs).exists = 0;
    }
    else {
      pWVar18 = wcs;
      pWVar19 = &__ptr->wcs;
      for (lVar13 = 9; lVar13 != 0; lVar13 = lVar13 + -1) {
        uVar3 = *(undefined4 *)&pWVar18->field_0x4;
        pWVar19->exists = pWVar18->exists;
        *(undefined4 *)&pWVar19->field_0x4 = uVar3;
        pWVar18 = (WCSdata *)((long)pWVar18 + (ulong)bVar26 * -0x10 + 8);
        pWVar19 = (WCSdata *)((long)pWVar19 + (ulong)bVar26 * -0x10 + 8);
      }
    }
    __s = (char *)malloc(0x200);
    if (__s != (char *)0x0) {
      local_88 = wcs;
      __stream = fopen64(filename,"r");
      if (__stream == (FILE *)0x0) {
        snprintf(__s,0x200,"Could not open Region file %s.",filename);
        ffpmsg(__s);
        free(__s);
        free(__ptr);
        *status = 0x68;
        return 0x68;
      }
      *status = 0x68;
      local_48 = local_88->type;
      iVar6 = 0;
      sVar22 = 0x200;
      local_80 = 0.0;
      local_70 = 0.0;
      local_78 = "Galactic region coordinates not supported";
      local_90 = __ptr;
      local_38 = Rgn;
LAB_001a7a47:
      do {
        pcVar7 = fgets(__s,(int)sVar22,__stream);
        if (pcVar7 == (char *)0x0) {
          fits_set_region_components(local_90);
LAB_001a8a88:
          if (*status != 0) goto LAB_001a8a0b;
          *local_38 = local_90;
          goto LAB_001a8a15;
        }
        *status = 0;
        sVar8 = strlen(__s);
        for (; (sVar8 == sVar22 - 1 && (__s[sVar8 - 1] != '\n')); sVar8 = sVar8 + sVar9) {
          pcVar7 = (char *)realloc(__s,sVar22 * 2);
          if (pcVar7 == (char *)0x0) {
            iVar4 = 0x71;
            local_d8 = "Couldn\'t allocate memory to hold Region file contents.";
            goto LAB_001a8a02;
          }
          fgets(pcVar7 + sVar8,(int)sVar22 + 1,__stream);
          sVar9 = strlen(pcVar7 + sVar8);
          __s = pcVar7;
          sVar22 = sVar22 * 2;
        }
        if (*__s != '#') {
          iVar4 = fits_strncasecmp(__s,"glob",4);
          pcVar7 = __s;
          if (iVar4 != 0) {
LAB_001a7bd9:
            if (*pcVar7 != '\0') {
              uStackY_f0 = 1;
              bVar25 = false;
              pcVar20 = (char *)0x0;
              pcVar24 = pcVar7;
              iVar4 = iVar6;
LAB_001a7bf9:
              pcVar17 = pcVar24;
              pcVar16 = pcVar20;
              uVar21 = (uint)uStackY_f0;
              if (bVar25) goto LAB_001a7cb6;
              if (*status != 0) goto LAB_001a8aa7;
              cVar1 = *pcVar17;
              pcVar20 = pcVar16;
              switch(cVar1) {
              case '#':
switchD_001a7c21_caseD_23:
                *pcVar17 = '\0';
                bVar25 = pcVar16 == (char *)0x0;
                pcVar24 = pcVar17;
                goto LAB_001a7bf9;
              case '$':
              case '%':
              case '&':
              case '\'':
              case '*':
              case '+':
                goto switchD_001a7c21_caseD_24;
              case '(':
                *pcVar17 = '\0';
                bVar25 = false;
                pcVar20 = pcVar17 + 1;
                pcVar24 = pcVar17 + 1;
                if (pcVar16 != (char *)0x0) {
                  *status = 1;
                  goto LAB_001a7cac;
                }
                goto LAB_001a7bf9;
              case ')':
                goto switchD_001a7c21_caseD_29;
              case ',':
                uStackY_f0 = (ulong)(uVar21 + 1);
                goto switchD_001a7c21_caseD_24;
              default:
                if (cVar1 == '\n') goto switchD_001a7c21_caseD_23;
              }
              if (cVar1 == ':') {
                if (pcVar16 != (char *)0x0) {
                  iVar4 = 2;
                }
                goto LAB_001a7cac;
              }
              if (cVar1 != 'd') {
                if (cVar1 != '\0') goto switchD_001a7c21_caseD_24;
                goto LAB_001a8aa7;
              }
              if (pcVar16 != (char *)0x0) {
                iVar4 = 1;
              }
              goto LAB_001a7cac;
            }
          }
          goto LAB_001a7a47;
        }
        ppuVar10 = __ctype_b_loc();
        pcVar7 = __s + 7;
        pcVar20 = __s;
        do {
          pcVar16 = pcVar7;
          pcVar24 = pcVar20 + 1;
          pcVar20 = pcVar20 + 1;
          pcVar7 = pcVar16 + 1;
        } while ((*(byte *)((long)*ppuVar10 + (long)*pcVar24 * 2 + 1) & 0x20) != 0);
        iVar4 = fits_strncasecmp(pcVar20,"format:",7);
        if (iVar4 == 0) {
          iVar4 = 0x1af;
          if (local_90->nShapes != 0) {
            local_d8 = "Format code encountered after reading 1 or more shapes.";
            goto LAB_001a8a02;
          }
          do {
            pcVar7 = pcVar16 + 1;
            pcVar16 = pcVar16 + 1;
          } while ((*(byte *)((long)*ppuVar10 + (long)*pcVar7 * 2 + 1) & 0x20) != 0);
          iVar5 = fits_strncasecmp(pcVar16,"pixel",5);
          iVar6 = 0;
          if (iVar5 != 0) {
            iVar5 = fits_strncasecmp(pcVar16,"degree",6);
            iVar6 = 1;
            if (iVar5 != 0) {
              iVar5 = fits_strncasecmp(pcVar16,"hhmmss",6);
              iVar6 = 2;
              if (iVar5 != 0) {
                iVar5 = fits_strncasecmp(pcVar16,"hms",3);
                iVar6 = 2;
                if (iVar5 != 0) {
                  local_d8 = "Unknown format code encountered in region file.";
LAB_001a8a02:
                  ffpmsg(local_d8);
                  *status = iVar4;
LAB_001a8a0b:
                  fits_free_region(local_90);
LAB_001a8a15:
                  fclose(__stream);
                  free(__s);
                  return *status;
                }
              }
            }
          }
        }
      } while( true );
    }
    free(__ptr);
  }
  ffpmsg("Couldn\'t allocate memory to hold Region file contents.");
  *status = 0x71;
  return 0x71;
LAB_001a7cb6:
  local_98 = pcVar17;
  if (*status != 0) {
LAB_001a8aa7:
    local_d8 = "Error reading Region file";
    goto LAB_001a8aae;
  }
  local_50 = __ctype_b_loc();
  local_d8 = pcVar7 + -1;
  do {
    pcVar24 = pcVar7;
    pcVar20 = local_d8;
    local_d8 = pcVar20 + 1;
    pcVar7 = pcVar24 + 1;
  } while ((*(byte *)((long)*local_50 + (long)pcVar20[1] * 2 + 1) & 0x20) != 0);
  pcVar7 = local_98;
  iVar6 = iVar4;
  if (pcVar16 == (char *)0x0 && pcVar20[1] == '\0') goto LAB_001a7bd9;
  iVar6 = fits_strncasecmp(local_d8,"image;",6);
  if (iVar6 != 0) {
    iVar6 = fits_strncasecmp(local_d8,"physical;",9);
    if (iVar6 == 0) {
      local_d8 = pcVar20 + 10;
      goto LAB_001a7ed7;
    }
    iVar6 = fits_strncasecmp(local_d8,"linear;",7);
    if (iVar6 == 0) {
      local_d8 = pcVar20 + 8;
      goto LAB_001a7ed7;
    }
    iVar6 = fits_strncasecmp(local_d8,"fk4;",4);
    if ((iVar6 == 0) || (iVar6 = fits_strncasecmp(local_d8,"fk5;",4), iVar6 == 0)) {
      local_d8 = pcVar20 + 5;
LAB_001a7ee0:
      iVar4 = 1;
      goto LAB_001a7ee7;
    }
    iVar6 = fits_strncasecmp(local_d8,"icrs;",5);
    if (iVar6 == 0) {
      local_d8 = pcVar20 + 6;
      goto LAB_001a7ee0;
    }
    iVar5 = fits_strncasecmp(local_d8,"fk5",3);
    iVar6 = 1;
    pcVar7 = local_98;
    if (iVar5 == 0) goto LAB_001a7bd9;
    iVar5 = fits_strncasecmp(local_d8,"fk4",3);
    iVar6 = 1;
    pcVar7 = local_98;
    if (iVar5 == 0) goto LAB_001a7bd9;
    iVar5 = fits_strncasecmp(local_d8,"icrs",4);
    iVar6 = 1;
    pcVar7 = local_98;
    if (iVar5 == 0) goto LAB_001a7bd9;
    iVar5 = fits_strncasecmp(local_d8,"image",5);
    iVar6 = 0;
    pcVar7 = local_98;
    if ((iVar5 == 0) ||
       (iVar5 = fits_strncasecmp(local_d8,"physical",8), pcVar7 = local_98, iVar5 == 0))
    goto LAB_001a7bd9;
    iVar6 = fits_strncasecmp(local_d8,"galactic;",9);
    if (iVar6 != 0) {
      iVar6 = fits_strncasecmp(local_d8,"ecliptic;",9);
      if (iVar6 == 0) {
        local_78 = "ecliptic region coordinates not supported";
        local_d8 = pcVar24;
        goto LAB_001a8b4e;
      }
      goto LAB_001a7ee7;
    }
LAB_001a8b4e:
    ffpmsg(local_78);
LAB_001a8aae:
    iVar4 = 0x1af;
    goto LAB_001a8a02;
  }
  local_d8 = pcVar20 + 7;
LAB_001a7ed7:
  iVar4 = 0;
LAB_001a7ee7:
  iVar6 = local_90->nShapes;
  lVar13 = (long)iVar6;
  pRVar11 = local_90->Shapes;
  if (iVar6 % 10 == 0) {
    if (pRVar11 == (RgnShape *)0x0) {
      pRVar11 = (RgnShape *)malloc(0x690);
    }
    else {
      pRVar11 = (RgnShape *)realloc(pRVar11,lVar13 * 0xa8 + 0x690);
    }
    if (pRVar11 == (RgnShape *)0x0) {
      local_d8 = "Failed to allocate memory for Region data";
      goto LAB_001a8b37;
    }
    local_90->Shapes = pRVar11;
  }
  ppuVar10 = local_50;
  local_90->nShapes = iVar6 + 1;
  newShape = pRVar11 + lVar13;
  pRVar11 = pRVar11 + lVar13;
  paVar14 = &pRVar11->param;
  pRVar11->sign = '\x01';
  pRVar11->shape = point_rgn;
  for (lVar13 = 0; lVar13 != 8; lVar13 = lVar13 + 1) {
    *(undefined8 *)((long)paVar14 + lVar13 * 8) = 0;
  }
  (newShape->param).gen.a = 0.0;
  (newShape->param).gen.b = 0.0;
  (newShape->param).gen.sinT = 0.0;
  (newShape->param).gen.cosT = 0.0;
  puVar23 = *local_50;
  do {
    pcVar7 = local_d8;
    cVar1 = *pcVar7;
    local_d8 = pcVar7 + 1;
  } while ((*(byte *)((long)puVar23 + (long)cVar1 * 2 + 1) & 0x20) != 0);
  pcVar20 = local_d8;
  if ((cVar1 != '+') && (pcVar20 = pcVar7, cVar1 == '-')) {
    newShape->sign = '\0';
    pcVar20 = local_d8;
  }
  local_d8 = pcVar20 + -1;
  do {
    pcVar7 = local_d8;
    local_d8 = pcVar7 + 1;
  } while ((*(byte *)((long)puVar23 + (long)pcVar7[1] * 2 + 1) & 0x20) != 0);
  if (pcVar7[1] == '\0') {
    local_d8 = "Error reading Region file";
    goto LAB_001a8aae;
  }
  sVar8 = strlen(local_d8);
  pcVar7 = pcVar7 + sVar8;
  while ((*(byte *)((long)puVar23 + (long)*pcVar7 * 2 + 1) & 0x20) != 0) {
    *pcVar7 = '\0';
    pcVar7 = pcVar7 + -1;
    puVar23 = *ppuVar10;
  }
  iVar6 = fits_strcasecmp(local_d8,"circle");
  if (iVar6 == 0) {
    newShape->shape = circle_rgn;
    uStackY_f0 = 2;
    if (uVar21 != 3) {
LAB_001a8b01:
      *status = 0x1af;
      goto LAB_001a8b0c;
    }
  }
  else {
    iVar6 = fits_strcasecmp(local_d8,"annulus");
    if (iVar6 == 0) {
      newShape->shape = annulus_rgn;
LAB_001a8241:
      uStackY_f0 = 2;
LAB_001a8243:
      if (uVar21 != 4) goto LAB_001a8b01;
    }
    else {
      iVar6 = fits_strcasecmp(local_d8,"ellipse");
      if (iVar6 == 0) {
        if (uVar21 - 9 < 0xfffffffb) goto LAB_001a8b01;
        if (uVar21 < 6) {
          newShape->shape = ellipse_rgn;
          goto LAB_001a835a;
        }
        newShape->shape = elliptannulus_rgn;
LAB_001a82f7:
        (newShape->param).gen.p[6] = 0.0;
        (newShape->param).gen.p[7] = 0.0;
      }
      else {
        iVar6 = fits_strcasecmp(local_d8,"elliptannulus");
        if (iVar6 == 0) {
          newShape->shape = elliptannulus_rgn;
          if ((uVar21 != 6) && (uVar21 != 8)) {
            *status = 0x1af;
          }
          goto LAB_001a82f7;
        }
        iVar6 = fits_strcasecmp(local_d8,"box");
        if ((iVar6 == 0) || (iVar6 = fits_strcasecmp(local_d8,"rotbox"), iVar6 == 0)) {
          if (uVar21 - 9 < 0xfffffffb) goto LAB_001a8b01;
          if (uVar21 < 6) {
            newShape->shape = box_rgn;
            goto LAB_001a835a;
          }
          newShape->shape = boxannulus_rgn;
          goto LAB_001a82f7;
        }
        iVar6 = fits_strcasecmp(local_d8,"rectangle");
        if ((iVar6 == 0) || (iVar6 = fits_strcasecmp(local_d8,"rotrectangle"), iVar6 == 0)) {
          newShape->shape = rectangle_rgn;
          if (uVar21 - 6 < 0xfffffffe) {
            *status = 0x1af;
          }
          (newShape->param).gen.p[4] = 0.0;
          uStackY_f0 = 4;
          goto LAB_001a8367;
        }
        iVar6 = fits_strcasecmp(local_d8,"diamond");
        if ((((iVar6 != 0) && (iVar6 = fits_strcasecmp(local_d8,"rotdiamond"), iVar6 != 0)) &&
            (iVar6 = fits_strcasecmp(local_d8,"rhombus"), iVar6 != 0)) &&
           (iVar6 = fits_strcasecmp(local_d8,"rotrhombus"), iVar6 != 0)) {
          iVar6 = fits_strcasecmp(local_d8,"sector");
          if ((iVar6 == 0) || (iVar6 = fits_strcasecmp(local_d8,"pie"), iVar6 == 0)) {
            newShape->shape = sector_rgn;
            goto LAB_001a8241;
          }
          iVar6 = fits_strcasecmp(local_d8,"point");
          if (iVar6 == 0) {
            newShape->shape = point_rgn;
            uStackY_f0 = 2;
            if (uVar21 != 2) goto LAB_001a8b01;
          }
          else {
            iVar6 = fits_strcasecmp(local_d8,"line");
            if (iVar6 == 0) {
              newShape->shape = line_rgn;
              uStackY_f0 = 4;
              goto LAB_001a8243;
            }
            iVar6 = fits_strcasecmp(local_d8,"polygon");
            if (iVar6 == 0) {
              newShape->shape = poly_rgn;
              if (((int)uVar21 < 6) || ((uStackY_f0 & 1) != 0)) goto LAB_001a8b01;
            }
            else {
              iVar6 = fits_strcasecmp(local_d8,"panda");
              if (iVar6 != 0) {
                iVar6 = fits_strcasecmp(local_d8,"epanda");
                if (iVar6 == 0) {
                  newShape->shape = epanda_rgn;
                }
                else {
                  iVar6 = fits_strcasecmp(local_d8,"bpanda");
                  if (iVar6 != 0) {
                    local_78 = "Unrecognized region found in region file:";
                    goto LAB_001a8b4e;
                  }
                  newShape->shape = bpanda_rgn;
                }
                if (uVar21 - 0xc < 0xfffffffe) {
                  *status = 0x1af;
                }
                (newShape->param).gen.p[10] = 0.0;
                goto LAB_001a835f;
              }
              newShape->shape = panda_rgn;
              uStackY_f0 = 2;
              if (uVar21 != 8) goto LAB_001a8b01;
            }
          }
          goto LAB_001a8367;
        }
        newShape->shape = diamond_rgn;
        if (uVar21 - 6 < 0xfffffffe) {
          *status = 0x1af;
        }
LAB_001a835a:
        (newShape->param).gen.p[4] = 0.0;
      }
LAB_001a835f:
      uStackY_f0 = 2;
    }
  }
LAB_001a8367:
  if (*status != 0) {
LAB_001a8b0c:
    ffpmsg("Wrong number of parameters found for region");
    ffpmsg(local_d8);
    goto LAB_001a8a88;
  }
  local_58 = (long)(int)uVar21;
  local_a8 = paVar14;
  if (newShape->shape == poly_rgn) {
    local_a8 = (anon_union_120_2_131c4ffb_for_param *)malloc(local_58 * 8);
    (newShape->param).poly.Pts = (double *)local_a8;
    if (local_a8 == (anon_union_120_2_131c4ffb_for_param *)0x0) {
      local_d8 = "Could not allocate memory to hold polygon parameters";
LAB_001a8b37:
      iVar4 = 0x71;
      goto LAB_001a8a02;
    }
    (paVar14->poly).nPts = uVar21;
  }
  local_40 = uStackY_f0;
  iVar6 = iVar4;
  for (uVar15 = 0; uVar15 < local_40; uVar15 = uVar15 + 2) {
    pcVar7 = pcVar16 + 2;
    pcVar20 = pcVar16;
    do {
      pcVar17 = pcVar20;
      pcVar24 = pcVar7;
      pcVar7 = pcVar24 + 1;
      pcVar20 = pcVar17 + 1;
    } while (*pcVar17 != ',');
    *pcVar17 = '\0';
    for (; (pcVar24[-1] != '\0' && (pcVar24[-1] != ',')); pcVar24 = pcVar24 + 1) {
    }
    pcVar24[-1] = '\0';
    pcVar7 = strchr(pcVar16,0x3a);
    if (pcVar7 == (char *)0x0) {
      local_b0 = atof(pcVar16);
      dVar27 = atof(pcVar17 + 1);
    }
    else {
      lVar13 = strtol(pcVar16,&endp,10);
      dVar27 = 0.0;
      if ((endp == (char *)0x0) || (*endp != ':')) {
        lVar12 = 0;
      }
      else {
        lVar12 = strtol(endp + 1,&endp,10);
        if ((endp == (char *)0x0) || (*endp != ':')) {
          dVar27 = 0.0;
        }
        else {
          dVar27 = atof(endp + 1);
        }
      }
      do {
        cVar1 = pcVar17[1];
        pcVar17 = pcVar17 + 1;
      } while ((*(byte *)((long)*local_50 + (long)cVar1 * 2 + 1) & 0x20) != 0);
      local_b0 = (dVar27 / 3600.0 + (double)lVar12 / 60.0 + (double)lVar13) * 15.0;
      lVar13 = strtol(pcVar17 + (cVar1 == '-'),&endp,10);
      dVar27 = 0.0;
      if ((endp == (char *)0x0) || (*endp != ':')) {
        lVar12 = 0;
      }
      else {
        lVar12 = strtol(endp + 1,&endp,10);
        if ((endp == (char *)0x0) || (*endp != ':')) {
          dVar27 = 0.0;
        }
        else {
          dVar27 = atof(endp + 1);
        }
      }
      auVar31._0_8_ = (double)lVar12;
      if (cVar1 == '-') {
        auVar31._8_8_ = dVar27;
        auVar31 = divpd(auVar31,_DAT_001cca60);
        dVar27 = ((double)-lVar13 - auVar31._0_8_) - auVar31._8_8_;
      }
      else {
        auVar28._8_8_ = auVar31._0_8_;
        auVar28._0_8_ = dVar27;
        auVar31 = divpd(auVar28,_DAT_001cca50);
        dVar27 = auVar31._8_8_ + (double)lVar13 + auVar31._0_8_;
      }
      iVar6 = 2;
    }
    dVar29 = dVar27;
    dVar30 = local_b0;
    if (uVar15 != 0) {
      dVar29 = local_70;
      dVar30 = local_80;
    }
    if (iVar6 != 0) {
      if ((local_88 == (WCSdata *)0x0) || (local_80 = dVar29, local_88->exists == 0)) {
        local_d8 = "WCS information needed to convert region coordinates.";
        iVar4 = 0x1f9;
        goto LAB_001a8a02;
      }
      iVar4 = ffxypx(local_b0,dVar27,local_88->xrefval,local_88->yrefval,local_88->xrefpix,
                     local_88->yrefpix,local_88->xinc,local_88->yinc,local_88->rot,local_48,&x,&y,
                     status);
      dVar29 = local_80;
      local_b0 = x;
      dVar27 = y;
      if (iVar4 != 0) goto LAB_001a8adc;
    }
    *(double *)((long)local_a8 + uVar15 * 8) = local_b0;
    *(double *)((long)local_a8 + uVar15 * 8 + 8) = dVar27;
    pcVar16 = pcVar24;
    local_80 = dVar30;
    local_70 = dVar29;
  }
  for (; pcVar7 = pcVar16, (long)uVar15 < local_58; uVar15 = uVar15 + 1) {
    do {
      pcVar20 = pcVar7;
      if (*pcVar20 == '\0') break;
      pcVar7 = pcVar20 + 1;
    } while (*pcVar20 != ',');
    *pcVar20 = '\0';
    dVar27 = strtod(pcVar16,&endp);
    *(double *)((long)local_a8 + uVar15 * 8) = dVar27;
    if ((endp != (char *)0x0) &&
       (((cVar1 = *endp, cVar1 == '\"' || (cVar1 == 'd')) || (cVar1 == '\'')))) {
      dVar30 = 60.0;
      if (cVar1 != '\'') {
        dVar30 = *(double *)(&DAT_001cca40 + (ulong)(cVar1 == '\"') * 8);
      }
      iVar4 = ffxypx(local_80,(double)(~-(ulong)(local_70 < 0.0) & (ulong)-dVar27 |
                                      -(ulong)(local_70 < 0.0) & (ulong)dVar27) / dVar30 + local_70,
                     local_88->xrefval,local_88->yrefval,local_88->xrefpix,local_88->yrefpix,
                     local_88->xinc,local_88->yinc,local_88->rot,local_48,&x,&y,status);
      if (iVar4 != 0) goto LAB_001a8adc;
      dVar27 = x - (local_a8->gen).p[0];
      dVar30 = y - (local_a8->gen).p[1];
      *(double *)((long)local_a8 + uVar15 * 8) = SQRT(dVar30 * dVar30 + dVar27 * dVar27);
    }
    pcVar16 = pcVar20 + 1;
  }
  sVar2 = newShape->shape;
  if (sVar2 == elliptannulus_rgn) {
    if (uVar21 == 7) {
LAB_001a8860:
      (local_a8->gen).p[7] = (local_a8->gen).p[6];
    }
  }
  else if (uVar21 == 7 && sVar2 == boxannulus_rgn) goto LAB_001a8860;
  if (iVar6 == 0) goto switchD_001a8895_caseD_b;
  lVar13 = 0x10;
  uStackY_f0 = 0x18;
  lVar12 = 0x20;
  switch(sVar2) {
  case ellipse_rgn:
  case box_rgn:
  case rectangle_rgn:
  case diamond_rgn:
    goto switchD_001a8895_caseD_4;
  case elliptannulus_rgn:
  case boxannulus_rgn:
    lVar13 = 0x30;
    uStackY_f0 = 0x38;
    break;
  case sector_rgn:
  case panda_rgn:
    break;
  default:
    goto switchD_001a8895_caseD_b;
  case epanda_rgn:
  case bpanda_rgn:
    (local_a8->gen).p[2] = local_88->rot + (local_a8->gen).p[2];
    lVar13 = 0x18;
    uStackY_f0 = 0x50;
  }
  *(double *)((long)local_a8 + lVar13) = local_88->rot + *(double *)((long)local_a8 + lVar13);
  lVar12 = uStackY_f0;
switchD_001a8895_caseD_4:
  *(double *)((long)local_a8 + lVar12) = local_88->rot + *(double *)((long)local_a8 + lVar12);
switchD_001a8895_caseD_b:
  fits_setup_shape(newShape);
  pcVar7 = local_98;
  goto LAB_001a7bd9;
LAB_001a8adc:
  ffpmsg("Error converting region to pixel coordinates.");
  goto LAB_001a8a88;
switchD_001a7c21_caseD_29:
  *pcVar17 = '\0';
  bVar25 = true;
  pcVar24 = pcVar17 + 1;
  if (pcVar16 == (char *)0x0) {
    *status = 1;
    bVar25 = false;
    pcVar20 = (char *)0x0;
  }
  goto LAB_001a7bf9;
switchD_001a7c21_caseD_24:
LAB_001a7cac:
  bVar25 = false;
  pcVar20 = pcVar16;
  pcVar24 = pcVar17 + 1;
  goto LAB_001a7bf9;
}

Assistant:

int fits_read_ascii_region( const char *filename,
			    WCSdata    *wcs,
			    SAORegion  **Rgn,
			    int        *status )
/*  Read regions from a SAO-style region file and return the information     */
/*  in the "SAORegion" structure.  If it is nonNULL, use wcs to convert the  */
/*  region coordinates to pixels.  Return an error if region is in degrees   */
/*  but no WCS data is provided.                                             */
/*---------------------------------------------------------------------------*/
{
   char     *currLine;
   char     *namePtr, *paramPtr, *currLoc;
   char     *pX, *pY, *endp;
   long     allocLen, lineLen, hh, mm, dd;
   double   *coords, X, Y, x, y, ss, div, xsave= 0., ysave= 0.;
   int      nParams, nCoords, negdec;
   int      i, done;
   FILE     *rgnFile;
   coordFmt cFmt;
   SAORegion *aRgn;
   RgnShape *newShape, *tmpShape;

   if( *status ) return( *status );

   aRgn = (SAORegion *)malloc( sizeof(SAORegion) );
   if( ! aRgn ) {
      ffpmsg("Couldn't allocate memory to hold Region file contents.");
      return(*status = MEMORY_ALLOCATION );
   }
   aRgn->nShapes    =    0;
   aRgn->Shapes     = NULL;
   if( wcs && wcs->exists )
      aRgn->wcs = *wcs;
   else
      aRgn->wcs.exists = 0;

   cFmt = pixel_fmt; /* set default format */

   /*  Allocate Line Buffer  */

   allocLen = 512;
   currLine = (char *)malloc( allocLen * sizeof(char) );
   if( !currLine ) {
      free( aRgn );
      ffpmsg("Couldn't allocate memory to hold Region file contents.");
      return(*status = MEMORY_ALLOCATION );
   }

   /*  Open Region File  */

   if( (rgnFile = fopen( filename, "r" ))==NULL ) {
      snprintf(currLine,allocLen,"Could not open Region file %s.",filename);
      ffpmsg( currLine );
      free( currLine );
      free( aRgn );
      return( *status = FILE_NOT_OPENED );
   }
   
   /*  Read in file, line by line  */
   /*  First, set error status in case file is empty */ 
   *status = FILE_NOT_OPENED;

   while( fgets(currLine,allocLen,rgnFile) != NULL ) {

      /* reset status if we got here */
      *status = 0;

      /*  Make sure we have a full line of text  */

      lineLen = strlen(currLine);
      while( lineLen==allocLen-1 && currLine[lineLen-1]!='\n' ) {
         currLoc = (char *)realloc( currLine, 2 * allocLen * sizeof(char) );
         if( !currLoc ) {
            ffpmsg("Couldn't allocate memory to hold Region file contents.");
            *status = MEMORY_ALLOCATION;
            goto error;
         } else {
            currLine = currLoc;
         }
         fgets( currLine+lineLen, allocLen+1, rgnFile );
         allocLen += allocLen;
         lineLen  += strlen(currLine+lineLen);
      }

      currLoc = currLine;
      if( *currLoc == '#' ) {

         /*  Look to see if it is followed by a format statement...  */
         /*  if not skip line                                        */

         currLoc++;
         while( isspace(*currLoc) ) currLoc++;
         if( !fits_strncasecmp( currLoc, "format:", 7 ) ) {
            if( aRgn->nShapes ) {
               ffpmsg("Format code encountered after reading 1 or more shapes.");
               *status = PARSE_SYNTAX_ERR;
               goto error;
            }
            currLoc += 7;
            while( isspace(*currLoc) ) currLoc++;
            if( !fits_strncasecmp( currLoc, "pixel", 5 ) ) {
               cFmt = pixel_fmt;
            } else if( !fits_strncasecmp( currLoc, "degree", 6 ) ) {
               cFmt = degree_fmt;
            } else if( !fits_strncasecmp( currLoc, "hhmmss", 6 ) ) {
               cFmt = hhmmss_fmt;
            } else if( !fits_strncasecmp( currLoc, "hms", 3 ) ) {
               cFmt = hhmmss_fmt;
            } else {
               ffpmsg("Unknown format code encountered in region file.");
               *status = PARSE_SYNTAX_ERR;
               goto error;
            }
         }

      } else if( !fits_strncasecmp( currLoc, "glob", 4 ) ) {
		  /* skip lines that begin with the word 'global' */

      } else {

         while( *currLoc != '\0' ) {

            namePtr  = currLoc;
            paramPtr = NULL;
            nParams  = 1;

            /*  Search for closing parenthesis  */

            done = 0;
            while( !done && !*status && *currLoc ) {
               switch (*currLoc) {
               case '(':
                  *currLoc = '\0';
                  currLoc++;
                  if( paramPtr )   /* Can't have two '(' in a region! */
                     *status = 1;
                  else
                     paramPtr = currLoc;
                  break;
               case ')':
                  *currLoc = '\0';
                  currLoc++;
                  if( !paramPtr )  /* Can't have a ')' without a '(' first */
                     *status = 1;
                  else
                     done = 1;
                  break;
               case '#':
               case '\n':
                  *currLoc = '\0';
                  if( !paramPtr )  /* Allow for a blank line */
                     done = 1;
                  break;
               case ':':  
                  currLoc++;
                  if ( paramPtr ) cFmt = hhmmss_fmt; /* set format if parameter has : */
                  break;
               case 'd':
                  currLoc++;
                  if ( paramPtr ) cFmt = degree_fmt; /* set format if parameter has d */  
                  break;
               case ',':
                  nParams++;  /* Fall through to default */
               default:
                  currLoc++;
                  break;
               }
            }
            if( *status || !done ) {
               ffpmsg( "Error reading Region file" );
               *status = PARSE_SYNTAX_ERR;
               goto error;
            }

            /*  Skip white space in region name  */

            while( isspace(*namePtr) ) namePtr++;

            /*  Was this a blank line? Or the end of the current one  */

            if( ! *namePtr && ! paramPtr ) continue;

            /*  Check for format code at beginning of the line */

            if( !fits_strncasecmp( namePtr, "image;", 6 ) ) {
				namePtr += 6;
				cFmt = pixel_fmt;
            } else if( !fits_strncasecmp( namePtr, "physical;", 9 ) ) {
                                namePtr += 9;
                                cFmt = pixel_fmt;
            } else if( !fits_strncasecmp( namePtr, "linear;", 7 ) ) {
                                namePtr += 7;
                                cFmt = pixel_fmt;
            } else if( !fits_strncasecmp( namePtr, "fk4;", 4 ) ) {
				namePtr += 4;
				cFmt = degree_fmt;
            } else if( !fits_strncasecmp( namePtr, "fk5;", 4 ) ) {
				namePtr += 4;
				cFmt = degree_fmt;
            } else if( !fits_strncasecmp( namePtr, "icrs;", 5 ) ) {
				namePtr += 5;
				cFmt = degree_fmt;

            /* the following 5 cases support region files created by POW 
	       (or ds9 Version 4.x) which
               may have lines containing  only a format code, not followed
               by a ';' (and with no region specifier on the line).  We use
               the 'continue' statement to jump to the end of the loop and
               then continue reading the next line of the region file. */

            } else if( !fits_strncasecmp( namePtr, "fk5", 3 ) ) {
				cFmt = degree_fmt;
                                continue;  /* supports POW region file format */
            } else if( !fits_strncasecmp( namePtr, "fk4", 3 ) ) {
				cFmt = degree_fmt;
                                continue;  /* supports POW region file format */
            } else if( !fits_strncasecmp( namePtr, "icrs", 4 ) ) {
				cFmt = degree_fmt;
                                continue;  /* supports POW region file format */
            } else if( !fits_strncasecmp( namePtr, "image", 5 ) ) {
				cFmt = pixel_fmt;
                                continue;  /* supports POW region file format */
            } else if( !fits_strncasecmp( namePtr, "physical", 8 ) ) {
				cFmt = pixel_fmt;
                                continue;  /* supports POW region file format */


            } else if( !fits_strncasecmp( namePtr, "galactic;", 9 ) ) {
               ffpmsg( "Galactic region coordinates not supported" );
               ffpmsg( namePtr );
               *status = PARSE_SYNTAX_ERR;
               goto error;
            } else if( !fits_strncasecmp( namePtr, "ecliptic;", 9 ) ) {
               ffpmsg( "ecliptic region coordinates not supported" );
               ffpmsg( namePtr );
               *status = PARSE_SYNTAX_ERR;
               goto error;
            }

            /**************************************************/
            /*  We've apparently found a region... Set it up  */
            /**************************************************/

            if( !(aRgn->nShapes % 10) ) {
               if( aRgn->Shapes )
                  tmpShape = (RgnShape *)realloc( aRgn->Shapes,
                                                  (10+aRgn->nShapes)
                                                  * sizeof(RgnShape) );
               else
                  tmpShape = (RgnShape *) malloc( 10 * sizeof(RgnShape) );
               if( tmpShape ) {
                  aRgn->Shapes = tmpShape;
               } else {
                  ffpmsg( "Failed to allocate memory for Region data");
                  *status = MEMORY_ALLOCATION;
                  goto error;
               }

            }
            newShape        = &aRgn->Shapes[aRgn->nShapes++];
            newShape->sign  = 1;
            newShape->shape = point_rgn;
	    for (i=0; i<8; i++) newShape->param.gen.p[i] = 0.0;
	    newShape->param.gen.a = 0.0;
	    newShape->param.gen.b = 0.0;
	    newShape->param.gen.sinT = 0.0;
	    newShape->param.gen.cosT = 0.0;

            while( isspace(*namePtr) ) namePtr++;
            
			/*  Check for the shape's sign  */

            if( *namePtr=='+' ) {
               namePtr++;
            } else if( *namePtr=='-' ) {
               namePtr++;
               newShape->sign = 0;
            }

            /* Skip white space in region name */

            while( isspace(*namePtr) ) namePtr++;
            if( *namePtr=='\0' ) {
               ffpmsg( "Error reading Region file" );
               *status = PARSE_SYNTAX_ERR;
               goto error;
            }
            lineLen = strlen( namePtr ) - 1;
            while( isspace(namePtr[lineLen]) ) namePtr[lineLen--] = '\0';

            /*  Now identify the region  */

            if(        !fits_strcasecmp( namePtr, "circle"  ) ) {
               newShape->shape = circle_rgn;
               if( nParams != 3 )
                  *status = PARSE_SYNTAX_ERR;
               nCoords = 2;
            } else if( !fits_strcasecmp( namePtr, "annulus" ) ) {
               newShape->shape = annulus_rgn;
               if( nParams != 4 )
                  *status = PARSE_SYNTAX_ERR;
               nCoords = 2;
            } else if( !fits_strcasecmp( namePtr, "ellipse" ) ) {
               if( nParams < 4 || nParams > 8 ) {
                  *status = PARSE_SYNTAX_ERR;
	       } else if ( nParams < 6 ) {
		 newShape->shape = ellipse_rgn;
		 newShape->param.gen.p[4] = 0.0;
	       } else {
		 newShape->shape = elliptannulus_rgn;
		 newShape->param.gen.p[6] = 0.0;
		 newShape->param.gen.p[7] = 0.0;
	       }
               nCoords = 2;
            } else if( !fits_strcasecmp( namePtr, "elliptannulus" ) ) {
               newShape->shape = elliptannulus_rgn;
               if( !( nParams==8 || nParams==6 ) )
                  *status = PARSE_SYNTAX_ERR;
               newShape->param.gen.p[6] = 0.0;
               newShape->param.gen.p[7] = 0.0;
               nCoords = 2;
            } else if( !fits_strcasecmp( namePtr, "box"    ) 
                    || !fits_strcasecmp( namePtr, "rotbox" ) ) {
	       if( nParams < 4 || nParams > 8 ) {
		 *status = PARSE_SYNTAX_ERR;
	       } else if ( nParams < 6 ) {
		 newShape->shape = box_rgn;
		 newShape->param.gen.p[4] = 0.0;
	       } else {
		  newShape->shape = boxannulus_rgn;
		  newShape->param.gen.p[6] = 0.0;
		  newShape->param.gen.p[7] = 0.0;
	       }
	       nCoords = 2;
            } else if( !fits_strcasecmp( namePtr, "rectangle"    )
                    || !fits_strcasecmp( namePtr, "rotrectangle" ) ) {
               newShape->shape = rectangle_rgn;
               if( nParams < 4 || nParams > 5 )
                  *status = PARSE_SYNTAX_ERR;
               newShape->param.gen.p[4] = 0.0;
               nCoords = 4;
            } else if( !fits_strcasecmp( namePtr, "diamond"    )
                    || !fits_strcasecmp( namePtr, "rotdiamond" )
                    || !fits_strcasecmp( namePtr, "rhombus"    )
                    || !fits_strcasecmp( namePtr, "rotrhombus" ) ) {
               newShape->shape = diamond_rgn;
               if( nParams < 4 || nParams > 5 )
                  *status = PARSE_SYNTAX_ERR;
               newShape->param.gen.p[4] = 0.0;
               nCoords = 2;
            } else if( !fits_strcasecmp( namePtr, "sector"  )
                    || !fits_strcasecmp( namePtr, "pie"     ) ) {
               newShape->shape = sector_rgn;
               if( nParams != 4 )
                  *status = PARSE_SYNTAX_ERR;
               nCoords = 2;
            } else if( !fits_strcasecmp( namePtr, "point"   ) ) {
               newShape->shape = point_rgn;
               if( nParams != 2 )
                  *status = PARSE_SYNTAX_ERR;
               nCoords = 2;
            } else if( !fits_strcasecmp( namePtr, "line"    ) ) {
               newShape->shape = line_rgn;
               if( nParams != 4 )
                  *status = PARSE_SYNTAX_ERR;
               nCoords = 4;
            } else if( !fits_strcasecmp( namePtr, "polygon" ) ) {
               newShape->shape = poly_rgn;
               if( nParams < 6 || (nParams&1) )
                  *status = PARSE_SYNTAX_ERR;
               nCoords = nParams;
            } else if( !fits_strcasecmp( namePtr, "panda" ) ) {
               newShape->shape = panda_rgn;
               if( nParams != 8 )
                  *status = PARSE_SYNTAX_ERR;
               nCoords = 2;
            } else if( !fits_strcasecmp( namePtr, "epanda" ) ) {
               newShape->shape = epanda_rgn;
               if( nParams < 10 || nParams > 11 )
                  *status = PARSE_SYNTAX_ERR;
               newShape->param.gen.p[10] = 0.0;
               nCoords = 2;
            } else if( !fits_strcasecmp( namePtr, "bpanda" ) ) {
               newShape->shape = bpanda_rgn;
               if( nParams < 10 || nParams > 11 )
                  *status = PARSE_SYNTAX_ERR;
               newShape->param.gen.p[10] = 0.0;
               nCoords = 2;
            } else {
               ffpmsg( "Unrecognized region found in region file:" );
               ffpmsg( namePtr );
               *status = PARSE_SYNTAX_ERR;
               goto error;
            }
            if( *status ) {
               ffpmsg( "Wrong number of parameters found for region" );
               ffpmsg( namePtr );
               goto error;
            }

            /*  Parse Parameter string... convert to pixels if necessary  */

            if( newShape->shape==poly_rgn ) {
               newShape->param.poly.Pts = (double *)malloc( nParams
                                                            * sizeof(double) );
               if( !newShape->param.poly.Pts ) {
                  ffpmsg(
                      "Could not allocate memory to hold polygon parameters" );
                  *status = MEMORY_ALLOCATION;
                  goto error;
               }
               newShape->param.poly.nPts = nParams;
               coords = newShape->param.poly.Pts;
            } else
               coords = newShape->param.gen.p;

            /*  Parse the initial "WCS?" coordinates  */
            for( i=0; i<nCoords; i+=2 ) {

               pX = paramPtr;
               while( *paramPtr!=',' ) paramPtr++;
               *(paramPtr++) = '\0';

               pY = paramPtr;
               while( *paramPtr!=',' && *paramPtr != '\0' ) paramPtr++;
               *(paramPtr++) = '\0';

               if( strchr(pX, ':' ) ) {
                  /*  Read in special format & convert to decimal degrees  */
                  cFmt = hhmmss_fmt;
                  mm = 0;
                  ss = 0.;
                  hh = strtol(pX, &endp, 10);
                  if (endp && *endp==':') {
                      pX = endp + 1;
                      mm = strtol(pX, &endp, 10);
                      if (endp && *endp==':') {
                          pX = endp + 1;
                          ss = atof( pX );
                      }
                  }
                  X = 15. * (hh + mm/60. + ss/3600.); /* convert to degrees */

                  mm = 0;
                  ss = 0.;
                  negdec = 0;

                  while( isspace(*pY) ) pY++;
                  if (*pY=='-') {
                      negdec = 1;
                      pY++;
                  }
                  dd = strtol(pY, &endp, 10);
                  if (endp && *endp==':') {
                      pY = endp + 1;
                      mm = strtol(pY, &endp, 10);
                      if (endp && *endp==':') {
                          pY = endp + 1;
                          ss = atof( pY );
                      }
                  }
                  if (negdec)
                     Y = -dd - mm/60. - ss/3600.; /* convert to degrees */
                  else
                     Y = dd + mm/60. + ss/3600.;

               } else {
                  X = atof( pX );
                  Y = atof( pY );
               }
               if (i==0) {   /* save 1st coord. in case needed later */
                   xsave = X;
                   ysave = Y;
               }

               if( cFmt!=pixel_fmt ) {
                  /*  Convert to pixels  */
                  if( wcs==NULL || ! wcs->exists ) {
                     ffpmsg("WCS information needed to convert region coordinates.");
                     *status = NO_WCS_KEY;
                     goto error;
                  }
                  
                  if( ffxypx(  X,  Y, wcs->xrefval, wcs->yrefval,
                                      wcs->xrefpix, wcs->yrefpix,
                                      wcs->xinc,    wcs->yinc,
                                      wcs->rot,     wcs->type,
                              &x, &y, status ) ) {
                     ffpmsg("Error converting region to pixel coordinates.");
                     goto error;
                  }
                  X = x; Y = y;
               }
               coords[i]   = X;
               coords[i+1] = Y;

            }

            /*  Read in remaining parameters...  */

            for( ; i<nParams; i++ ) {
               pX = paramPtr;
               while( *paramPtr!=',' && *paramPtr != '\0' ) paramPtr++;
               *(paramPtr++) = '\0';
               coords[i] = strtod( pX, &endp );

	       if (endp && (*endp=='"' || *endp=='\'' || *endp=='d') ) {
		  div = 1.0;
		  if ( *endp=='"' ) div = 3600.0;
		  if ( *endp=='\'' ) div = 60.0;
		  /* parameter given in arcsec so convert to pixels. */
		  /* Increment first Y coordinate by this amount then calc */
		  /* the distance in pixels from the original coordinate. */
		  /* NOTE: This assumes the pixels are square!! */
		  if (ysave < 0.)
		     Y = ysave + coords[i]/div;  /* don't exceed -90 */
		  else
		     Y = ysave - coords[i]/div;  /* don't exceed +90 */

		  X = xsave;
		  if( ffxypx(  X,  Y, wcs->xrefval, wcs->yrefval,
			       wcs->xrefpix, wcs->yrefpix,
			       wcs->xinc,    wcs->yinc,
			       wcs->rot,     wcs->type,
                               &x, &y, status ) ) {
		     ffpmsg("Error converting region to pixel coordinates.");
		     goto error;
		  }
		 
		  coords[i] = sqrt( pow(x-coords[0],2) + pow(y-coords[1],2) );

               }
            }

	    /* special case for elliptannulus and boxannulus if only one angle
	       was given */

	    if ( (newShape->shape == elliptannulus_rgn || 
		  newShape->shape == boxannulus_rgn ) && nParams == 7 ) {
	      coords[7] = coords[6];
	    }

            /* Also, correct the position angle for any WCS rotation:  */
            /*    If regions are specified in WCS coordintes, then the angles */
            /*    are relative to the WCS system, not the pixel X,Y system */

	    if( cFmt!=pixel_fmt ) {	    
	      switch( newShape->shape ) {
	      case sector_rgn:
	      case panda_rgn:
		coords[2] += (wcs->rot);
		coords[3] += (wcs->rot);
		break;
	      case box_rgn:
	      case rectangle_rgn:
	      case diamond_rgn:
	      case ellipse_rgn:
		coords[4] += (wcs->rot);
		break;
	      case boxannulus_rgn:
	      case elliptannulus_rgn:
		coords[6] += (wcs->rot);
		coords[7] += (wcs->rot);
		break;
	      case epanda_rgn:
	      case bpanda_rgn:
		coords[2] += (wcs->rot);
		coords[3] += (wcs->rot);
		coords[10] += (wcs->rot);
              default:
                break;
	      }
	    }

	    /* do some precalculations to speed up tests */

	    fits_setup_shape(newShape);

         }  /* End of while( *currLoc ) */
/*
  if (coords)printf("%.8f %.8f %.8f %.8f %.8f\n",
   coords[0],coords[1],coords[2],coords[3],coords[4]); 
*/
      }  /* End of if...else parse line */
   }   /* End of while( fgets(rgnFile) ) */

   /* set up component numbers */

   fits_set_region_components( aRgn );

error:

   if( *status ) {
      fits_free_region( aRgn );
   } else {
      *Rgn = aRgn;
   }

   fclose( rgnFile );
   free( currLine );

   return( *status );
}